

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O0

void leb_MergeNodeConforming(leb_Heap *leb,leb_Node node,leb_DiamondParent diamond)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  leb_Node node_00;
  leb_Node lVar4;
  bool b3;
  bool b2;
  bool b1;
  leb_Node dualNode;
  leb_Heap *leb_local;
  leb_DiamondParent diamond_local;
  leb_Node node_local;
  
  bVar1 = leb_IsRootNode(leb,node);
  if (!bVar1) {
    node_00 = leb__RightChildNode(diamond.top);
    lVar4 = leb__SiblingNode_Fast(node);
    bVar1 = leb_IsLeafNode(leb,lVar4);
    bVar2 = leb_IsLeafNode(leb,node_00);
    lVar4 = leb__SiblingNode(node_00);
    bVar3 = leb_IsLeafNode(leb,lVar4);
    if (((bVar1) && (bVar2)) && (bVar3)) {
      leb__MergeNode(leb,node);
      leb__MergeNode(leb,node_00);
    }
  }
  return;
}

Assistant:

LEBDEF void
leb_MergeNodeConforming(
    leb_Heap *leb,
    const leb_Node node,
    const leb_DiamondParent diamond
) {
    if (!leb_IsRootNode(leb, node)) {
        leb_Node dualNode = leb__RightChildNode(diamond.top);
        bool b1 = leb_IsLeafNode(leb, leb__SiblingNode_Fast(node));
        bool b2 = leb_IsLeafNode(leb, dualNode);
        bool b3 = leb_IsLeafNode(leb, leb__SiblingNode(dualNode));

        if (b1 && b2 && b3) {
            leb__MergeNode(leb, node);
            leb__MergeNode(leb, dualNode);
        }
    }
}